

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_difflist_add(lyd_difflist *diff,uint *size,uint index,LYD_DIFFTYPE type,lyd_node *first,
                    lyd_node *second)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  LYD_DIFFTYPE *pLVar4;
  lyd_node **pplVar5;
  LY_ERR *pLVar6;
  
  if (diff == (lyd_difflist *)0x0) {
    __assert_fail("diff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x96c,
                  "int lyd_difflist_add(struct lyd_difflist *, unsigned int *, unsigned int, LYD_DIFFTYPE, struct lyd_node *, struct lyd_node *)"
                 );
  }
  if ((size == (uint *)0x0) || (uVar2 = *size, uVar2 == 0)) {
    __assert_fail("size && *size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x96d,
                  "int lyd_difflist_add(struct lyd_difflist *, unsigned int *, unsigned int, LYD_DIFFTYPE, struct lyd_node *, struct lyd_node *)"
                 );
  }
  uVar1 = index + 1;
  if (uVar1 == uVar2) {
    *size = uVar2 + 0x10;
    pLVar4 = (LYD_DIFFTYPE *)realloc(diff->type,(ulong)(uVar2 + 0x10) << 2);
    if (pLVar4 != (LYD_DIFFTYPE *)0x0) {
      diff->type = pLVar4;
      pplVar5 = (lyd_node **)realloc(diff->first,(ulong)*size << 3);
      if (pplVar5 != (lyd_node **)0x0) {
        diff->first = pplVar5;
        pplVar5 = (lyd_node **)realloc(diff->second,(ulong)*size << 3);
        if (pplVar5 != (lyd_node **)0x0) {
          diff->second = pplVar5;
          goto LAB_00160b27;
        }
      }
    }
    pLVar6 = ly_errno_location();
    *pLVar6 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_difflist_add");
    iVar3 = 1;
  }
  else {
LAB_00160b27:
    diff->type[index] = type;
    diff->first[index] = first;
    diff->second[index] = second;
    diff->type[uVar1] = LYD_DIFF_END;
    iVar3 = 0;
    diff->first[uVar1] = (lyd_node *)0x0;
    diff->second[uVar1] = (lyd_node *)0x0;
  }
  return iVar3;
}

Assistant:

static int
lyd_difflist_add(struct lyd_difflist *diff, unsigned int *size, unsigned int index,
                 LYD_DIFFTYPE type, struct lyd_node *first, struct lyd_node *second)
{
    void *new;

    assert(diff);
    assert(size && *size);

    if (index + 1 == *size) {
        /* it's time to enlarge */
        *size = *size + 16;
        new = realloc(diff->type, *size * sizeof *diff->type);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->type = new;

        new = realloc(diff->first, *size * sizeof *diff->first);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->first = new;

        new = realloc(diff->second, *size * sizeof *diff->second);
        if (!new) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        diff->second = new;
    }

    /* insert the item */
    diff->type[index] = type;
    diff->first[index] = first;
    diff->second[index] = second;

    /* terminate the arrays */
    index++;
    diff->type[index] = LYD_DIFF_END;
    diff->first[index] = NULL;
    diff->second[index] = NULL;

    return EXIT_SUCCESS;
}